

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O2

void __thiscall
GraphTestDyndepLoadOutputWithMultipleRules1::Run(GraphTestDyndepLoadOutputWithMultipleRules1 *this)

{
  Test *pTVar1;
  bool bVar2;
  Node *pNVar3;
  string err;
  allocator<char> local_62;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  AssertParse(&(this->super_GraphTest).super_StateTestWithBuiltinRules.state_,
              "rule r\n  command = unused\nbuild out1 | out-twice.imp: r in1\nbuild out2: r in2 || dd\n  dyndep = dd\n"
              ,(ManifestParserOptions)0x0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"dd",&local_62);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"ninja_dyndep_version = 1\nbuild out2 | out-twice.imp: dyndep\n",
             &local_61);
  VirtualFileSystem::Create(&(this->super_GraphTest).fs_,&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = g_current_test;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"dd",&local_62);
  pNVar3 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_60);
  bVar2 = testing::Test::Check
                    (pTVar1,pNVar3->dyndep_pending_,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
                     ,0x244,"GetNode(\"dd\")->dyndep_pending()");
  std::__cxx11::string::~string((string *)&local_60);
  pTVar1 = g_current_test;
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"dd",&local_62);
    pNVar3 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_60);
    bVar2 = DependencyScan::LoadDyndeps(&(this->super_GraphTest).scan_,pNVar3,&local_40);
    testing::Test::Check
              (pTVar1,!bVar2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
               ,0x245,"scan_.LoadDyndeps(GetNode(\"dd\"), &err)");
    std::__cxx11::string::~string((string *)&local_60);
    pTVar1 = g_current_test;
    bVar2 = std::operator==("multiple rules generate out-twice.imp",&local_40);
    testing::Test::Check
              (pTVar1,bVar2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
               ,0x246,"\"multiple rules generate out-twice.imp\" == err");
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

TEST_F(GraphTest, DyndepLoadOutputWithMultipleRules1) {
  AssertParse(&state_,
"rule r\n"
"  command = unused\n"
"build out1 | out-twice.imp: r in1\n"
"build out2: r in2 || dd\n"
"  dyndep = dd\n"
  );
  fs_.Create("dd",
"ninja_dyndep_version = 1\n"
"build out2 | out-twice.imp: dyndep\n"
  );

  string err;
  ASSERT_TRUE(GetNode("dd")->dyndep_pending());
  EXPECT_FALSE(scan_.LoadDyndeps(GetNode("dd"), &err));
  EXPECT_EQ("multiple rules generate out-twice.imp", err);
}